

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_format.hpp
# Opt level: O0

ssize_t lightconf::config_format::read(int __fd,void *__buf,size_t __nbytes)

{
  undefined8 input;
  undefined4 in_register_0000003c;
  scanner_params local_b8;
  undefined1 local_90 [8];
  scanner sc;
  string *src_local;
  
  sc.params_._32_8_ = __buf;
  scanner::scanner((scanner *)local_90);
  input = sc.params_._32_8_;
  scanner_params::scanner_params(&local_b8,(scanner_params *)default_scanner_params);
  scanner::scan((scanner *)local_90,(string *)input,&local_b8);
  scanner_params::~scanner_params(&local_b8);
  read_group((group *)CONCAT44(in_register_0000003c,__fd),(scanner *)local_90,false);
  scanner::~scanner((scanner *)local_90);
  return (ssize_t)(group *)CONCAT44(in_register_0000003c,__fd);
}

Assistant:

inline group read(const std::string& src) {
    scanner sc;
    sc.scan(src);
    return read_group(sc, false);
}